

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribfunction.cpp
# Opt level: O0

double __thiscall DistribFunction::getDistribSumSquares(DistribFunction *this)

{
  int i;
  double sumSquares;
  DistribFunction *this_local;
  
  sumSquares = 0.0;
  for (i = 0; i < this->numHistIntervals; i = i + 1) {
    sumSquares = this->distrib[i] * this->distrib[i] + sumSquares;
  }
  return sumSquares;
}

Assistant:

double DistribFunction::getDistribSumSquares( void ){
    double sumSquares = 0.0;
    for ( int i = 0; i < numHistIntervals; i++ ){
        sumSquares += distrib[i]*distrib[i];
    }
    return sumSquares; 
}